

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O0

void __thiscall
ProblemFireFighting::ProblemFireFighting
          (ProblemFireFighting *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,double costOfMove,
          bool forcePositionRepres)

{
  bool bVar1;
  ostream *poVar2;
  reference puVar3;
  reference pvVar4;
  MultiAgentDecisionProcessDiscrete *this_00;
  size_t sVar5;
  undefined8 in_RCX;
  pointer pAVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  size_type in_RSI;
  MultiAgentDecisionProcessDiscrete *in_RDI;
  byte in_R8B;
  double in_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  size_t testNRJO;
  size_t testNRJA;
  stringstream ss_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec_1;
  Index sI_1;
  size_t nrS_1;
  StateDistributionVector *isdv;
  Index hI;
  bool isStartState;
  Index t1;
  stringstream ss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec;
  Index sI;
  double ssprob;
  double nrStartStates;
  vector<double,_std::allocator<double>_> isd;
  const_iterator it;
  size_t nrS;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrPos_vec;
  size_t nrPos;
  double S;
  string *in_stack_fffffffffffff9a8;
  undefined1 uVar13;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffff9b0;
  ProblemFireFighting *in_stack_fffffffffffff9b8;
  string *in_stack_fffffffffffff9c0;
  string *in_stack_fffffffffffff9c8;
  string *in_stack_fffffffffffff9d0;
  undefined1 b;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffff9d8;
  ProblemFireFighting *in_stack_fffffffffffff9e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff9f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff9f8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffa00;
  const_iterator __position;
  ProblemFireFighting *in_stack_fffffffffffffa40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  MultiAgentDecisionProcessDiscrete *this_02;
  size_t in_stack_fffffffffffffa88;
  MultiAgentDecisionProcess *in_stack_fffffffffffffa90;
  string local_568 [32];
  string local_548 [24];
  ProblemFireFighting *in_stack_fffffffffffffad0;
  stringstream local_528 [16];
  ostream local_518 [144];
  size_t in_stack_fffffffffffffb78;
  size_t in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffb88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb98;
  ProblemFireFighting *in_stack_fffffffffffffc00;
  ProblemFireFighting *in_stack_fffffffffffffc20;
  uint local_384;
  string local_370 [36];
  uint local_34c;
  byte local_345;
  uint local_344;
  stringstream local_340 [16];
  ostream local_330 [404];
  uint local_19c;
  string *local_198;
  double local_190;
  undefined1 local_181 [49];
  unsigned_long *local_150;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148 [2];
  unsigned_long *local_138;
  unsigned_long *local_130;
  unsigned_long *local_128;
  unsigned_long *local_120;
  unsigned_long local_108 [3];
  undefined1 local_e9 [105];
  string local_80 [48];
  string local_50 [40];
  double local_28;
  undefined8 local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  size_type local_10;
  undefined1 auVar7 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 extraout_var_02 [56];
  
  local_50[0x27] = (string)(in_R8B & 1);
  this_02 = (MultiAgentDecisionProcessDiscrete *)
            &in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_02);
  POSGInterface::POSGInterface((POSGInterface *)this_02,&PTR_PTR_00d19b60);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_02,&PTR_PTR_00d19b48);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)
             &in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&PTR_construction_vtable_384__00d19b70);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_02,&PTR_construction_vtable_232__00d19b20);
  SoftPrintBriefDescription_abi_cxx11_
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  SoftPrintDescription_abi_cxx11_
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  SoftPrintBriefDescription_abi_cxx11_
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&in_stack_fffffffffffff9e0->super_DecPOMDPDiscrete,(void **)in_stack_fffffffffffff9d8,
             in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string((string *)(local_e9 + 0x49));
  std::__cxx11::string::~string(local_80);
  auVar12 = std::__cxx11::string::~string(local_50);
  auVar10._0_8_ = auVar12._8_8_;
  auVar7._0_8_ = auVar12._0_8_;
  auVar10._8_56_ = extraout_var_01;
  auVar9 = auVar10._0_16_;
  auVar7._8_56_ = extraout_var;
  auVar12 = auVar7._0_16_;
  *(undefined8 *)&in_RDI->super_MultiAgentDecisionProcess = 0xd19298;
  in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(vtable + 0x460);
  in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(vtable + 0x460);
  in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(vtable + 0x460);
  in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(vtable + 0x460);
  in_RDI[1].super_MultiAgentDecisionProcess._m_allAgentsScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(vtable + 0x6b8);
  *(undefined8 *)&in_RDI->field_0x200 = 0xd19510;
  in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_name._M_string_length = local_10;
  in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_name.field_2._M_allocated_capacity =
       (size_type)local_18;
  *(undefined8 *)((long)&in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_name.field_2 + 8) =
       local_20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9975ea);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x997606);
  MultiAgentDecisionProcessDiscrete::SetSparse(in_RDI,true);
  MultiAgentDecisionProcess::SetNrAgents(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  auVar12 = vcvtusi2sd_avx512f(auVar12,local_20);
  auVar9 = vcvtusi2sd_avx512f(auVar9,local_18);
  local_e9._65_8_ = pow(auVar12._0_8_,auVar9._0_8_);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_e9._65_8_;
  pAVar6 = (pointer)vcvttsd2usi_avx512f(auVar12);
  in_RDI[1].super_MultiAgentDecisionProcess._m_agents.
  super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.super__Vector_impl_data._M_start =
       pAVar6;
  this_01 = local_18;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x997694);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9d0,
             (size_type)in_stack_fffffffffffff9c8,(value_type_conflict2 *)in_stack_fffffffffffff9c0,
             (allocator_type *)in_stack_fffffffffffff9b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x9976f1);
  if ((0.0 < local_28) || (((byte)local_50[0x27] & 1) != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Including position");
    auVar12 = std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    auVar11._0_8_ = auVar12._8_8_;
    auVar8._0_8_ = auVar12._0_8_;
    auVar11._8_56_ = extraout_var_02;
    auVar8._8_56_ = extraout_var_00;
    in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_description._M_dataplus = (_Alloc_hider)0x1
    ;
    in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_description._M_string_length =
         (long)&(local_18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start + local_10;
    local_e9._25_8_ =
         (long)&(local_18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start + 1;
    in_stack_fffffffffffffa40 = (ProblemFireFighting *)local_e9;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x9977a6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9d0,
               (size_type)in_stack_fffffffffffff9c8,
               (value_type_conflict2 *)in_stack_fffffffffffff9c0,
               (allocator_type *)in_stack_fffffffffffff9b8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9b8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x997805);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x99782a);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9d0,
               (size_type)in_stack_fffffffffffff9c8,
               (value_type_conflict2 *)in_stack_fffffffffffff9c0,
               (allocator_type *)in_stack_fffffffffffff9b8);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x99785e);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (this_01,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)poVar2);
    local_120 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff9a8);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffff9b0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffff9a8);
    __position._M_current = local_108;
    local_128 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff9a8);
    local_130 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff9a8);
    local_138 = (unsigned_long *)
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                          (in_stack_fffffffffffff9f0,__position,in_stack_fffffffffffffa00,
                           in_stack_fffffffffffff9f8);
    local_148[1]._M_current = (unsigned_long *)0x1;
    local_150 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff9a8);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffff9b0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffff9a8);
    while( true ) {
      local_181._41_8_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff9a8);
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff9b0,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff9a8);
      auVar9 = auVar11._0_16_;
      auVar12 = auVar8._0_16_;
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_148);
      local_148[1]._M_current = *puVar3 * local_148[1]._M_current;
      local_181._33_8_ =
           __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20)
                       );
    }
    local_181._1_8_ = 0;
    in_stack_fffffffffffffa00._M_current = (unsigned_long *)local_181;
    std::allocator<double>::allocator((allocator<double> *)0x997b1b);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9d0,
               (size_type)in_stack_fffffffffffff9c8,
               (value_type_conflict3 *)in_stack_fffffffffffff9c0,
               (allocator_type *)in_stack_fffffffffffff9b8);
    std::allocator<double>::~allocator((allocator<double> *)0x997b49);
    auVar12 = vcvtusi2sd_avx512f(auVar12,local_20);
    auVar9 = vcvtusi2sd_avx512f(auVar9,local_18);
    local_190 = pow(auVar12._0_8_,auVar9._0_8_);
    local_198 = (string *)(1.0 / local_190);
    for (local_19c = 0; b = (undefined1)((ulong)in_stack_fffffffffffff9d0 >> 0x38),
        (ulong)local_19c < local_148[1]._M_current; local_19c = local_19c + 1) {
      GetStateVector(in_stack_fffffffffffff9b8,(Index)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
      std::__cxx11::stringstream::stringstream(local_340);
      std::operator<<(local_330,"S_");
      for (local_344 = 0;
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(ulong)local_344 < local_18;
          local_344 = local_344 + 1) {
        poVar2 = std::operator<<(local_330,"f");
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffff9b0,(size_type)in_stack_fffffffffffff9a8);
        std::ostream::operator<<(poVar2,*pvVar4);
      }
      local_345 = 1;
      for (; (ulong)local_344 <
             in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_description._M_string_length;
          local_344 = local_344 + 1) {
        in_stack_fffffffffffff9e0 =
             (ProblemFireFighting *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffff9b0,(size_type)in_stack_fffffffffffff9a8);
        local_34c = *(uint *)&(in_stack_fffffffffffff9e0->super_DecPOMDPDiscrete).
                              super_MultiAgentDecisionProcessDiscrete.
                              super_MultiAgentDecisionProcess;
        std::operator<<(local_330,"h");
        if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(ulong)local_34c == local_18) {
          std::operator<<(local_330,"S");
        }
        else {
          std::ostream::operator<<(local_330,local_34c);
          local_345 = 0;
        }
      }
      std::__cxx11::stringstream::str();
      MultiAgentDecisionProcessDiscrete::AddState
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      std::__cxx11::string::~string(local_370);
      if ((local_345 & 1) != 0) {
        in_stack_fffffffffffff9d0 = local_198;
        in_stack_fffffffffffff9d8 =
             (MultiAgentDecisionProcessDiscrete *)
             std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9b0,
                        (size_type)in_stack_fffffffffffff9a8);
        *(string **)&in_stack_fffffffffffff9d8->super_MultiAgentDecisionProcess =
             in_stack_fffffffffffff9d0;
      }
      std::__cxx11::stringstream::~stringstream(local_340);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9c0);
    }
    operator_new(0x20);
    StateDistributionVector::StateDistributionVector
              ((StateDistributionVector *)in_stack_fffffffffffff9c0,(SDV *)in_stack_fffffffffffff9b8
              );
    MultiAgentDecisionProcessDiscrete::SetISD
              (in_stack_fffffffffffff9b0,(StateDistribution *)in_stack_fffffffffffff9a8);
    uVar13 = (undefined1)((ulong)in_stack_fffffffffffff9a8 >> 0x38);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not including positions");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_description._M_dataplus = (_Alloc_hider)0x0
    ;
    in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_description._M_string_length =
         (size_type)local_18;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (this_01,in_stack_fffffffffffffa48);
    pAVar6 = in_RDI[1].super_MultiAgentDecisionProcess._m_agents.
             super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (local_384 = 0; b = (undefined1)((ulong)in_stack_fffffffffffff9d0 >> 0x38),
        (pointer)(ulong)local_384 < pAVar6; local_384 = local_384 + 1) {
      GetStateVector(in_stack_fffffffffffff9b8,(Index)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
      std::__cxx11::stringstream::stringstream(local_528);
      in_stack_fffffffffffff9b8 = (ProblemFireFighting *)std::operator<<(local_518,"S_");
      PrintTools::SoftPrintVector<unsigned_int>(in_stack_fffffffffffffb98);
      std::operator<<((ostream *)in_stack_fffffffffffff9b8,local_548);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::stringstream::str();
      MultiAgentDecisionProcessDiscrete::AddState
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::stringstream::~stringstream(local_528);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar2);
    }
    MultiAgentDecisionProcessDiscrete::SetUniformISD((MultiAgentDecisionProcessDiscrete *)0x99815e);
    uVar13 = (undefined1)((ulong)in_stack_fffffffffffff9a8 >> 0x38);
  }
  MultiAgentDecisionProcessDiscrete::SetStatesInitialized(in_stack_fffffffffffff9b0,(bool)uVar13);
  (**(code **)(*(long *)&in_RDI->field_0x200 + 0x68))(0x3ff0000000000000,&in_RDI->field_0x200);
  ConstructActions(in_stack_fffffffffffffc00);
  this_00 = (MultiAgentDecisionProcessDiscrete *)
            MultiAgentDecisionProcessDiscrete::ConstructJointActions
                      ((MultiAgentDecisionProcessDiscrete *)0x9981bb);
  MultiAgentDecisionProcessDiscrete::SetActionsInitialized(this_00,(bool)uVar13);
  ConstructObservations(in_stack_fffffffffffffc20);
  sVar5 = MultiAgentDecisionProcessDiscrete::ConstructJointObservations
                    ((MultiAgentDecisionProcessDiscrete *)0x9981ff);
  MultiAgentDecisionProcessDiscrete::SetObservationsInitialized(this_00,SUB81(sVar5 >> 0x38,0));
  uVar13 = (undefined1)((ulong)this_00 >> 0x38);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel
            ((MultiAgentDecisionProcessDiscrete *)in_stack_fffffffffffffa00._M_current);
  FillTransitionModel(in_stack_fffffffffffffad0);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel(this_02);
  FillObservationModel(in_stack_fffffffffffffa40);
  MultiAgentDecisionProcessDiscrete::SetInitialized(in_stack_fffffffffffff9d8,(bool)b);
  (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x178))();
  FillRewardModel(in_stack_fffffffffffff9e0);
  DecPOMDPDiscrete::SetInitialized(&in_stack_fffffffffffff9b8->super_DecPOMDPDiscrete,(bool)uVar13);
  return;
}

Assistant:

ProblemFireFighting::ProblemFireFighting(
        size_t nrAgents, size_t nrHouses, size_t nrFLs,
        double costOfMove, bool forcePositionRepres)
    :
        DecPOMDPDiscrete(
                SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs),
                SoftPrintDescription(nrAgents, nrHouses, nrFLs),
                SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs)
                )
        ,_m_nrAgents(nrAgents)
        ,_m_nrHouses(nrHouses)
        ,_m_nrFireLevels(nrFLs)
{
    SetSparse(true);
    SetNrAgents(nrAgents);


    double S = pow((double)nrFLs, (double)nrHouses);
    _m_nrJointFirelevels = (size_t) S;
    _m_nrFLs_vec =  vector<size_t>(nrHouses, nrFLs);

    //Create states, and ISD
    if(costOfMove > 0.0 || forcePositionRepres)
    {
        cout << "Including position"<<endl;
        _m_includePositions = true;
        //we're duplicating the generation of states as the matlab code does
        //(this is not the best thing as it generates states where one agent 
        //is in a start state and the other is not...)


        //the s_vec has the form <fl...fl_h, pos...pos_n>
        _m_nrStateFeatures = nrHouses+nrAgents;
        size_t nrPos = nrHouses+1; //include the 'start' position.

        _m_nrFLs_vec = vector<size_t>(nrHouses, nrFLs);
        vector< size_t > nrPos_vec = vector<size_t>(nrAgents, nrPos);
        _m_nrPerStateFeatureVec =  _m_nrFLs_vec;
        _m_nrPerStateFeatureVec.insert(
                _m_nrPerStateFeatureVec.end(), //insert position
                nrPos_vec.begin(),  //the stuff that is 
                nrPos_vec.end()     //appended...
                );
        if(DEBUG_PFF)
            cout << "_m_nrPerStateFeatureVec=" <<
                SoftPrintVector(_m_nrPerStateFeatureVec) << endl;
        size_t nrS=1;
        for(vector<size_t>::const_iterator it = _m_nrPerStateFeatureVec.begin();
                it < _m_nrPerStateFeatureVec.end();
                it++)
            nrS *= *it;

        vector<double> isd(nrS, 0.0);
        double nrStartStates = pow((double)nrFLs, (double)nrHouses);
        double ssprob = 1.0 / nrStartStates;

        for(Index sI = 0; sI < nrS; sI++)
        {
            vector< Index> s_vec = GetStateVector(sI);
            stringstream ss;
            ss << "S_";
            Index t1;
            for(t1 = 0; t1 < nrHouses; t1++)
                ss << "f" << s_vec.at(t1);
            bool isStartState = true;
            for(; t1 < _m_nrStateFeatures; t1++)
            {
                Index hI =  s_vec.at(t1);
                ss << "h";
                if(hI == nrHouses) //start position
                    ss << "S";
                else
                {
                    ss << hI;
                    isStartState = false;
                }
            }
            this->AddState(ss.str());
            if(isStartState)
                isd.at(sI) = ssprob;

            if(DEBUG_PFF)
            {
                cout << "added " << this->GetState(sI)->SoftPrintBrief()<<endl;
            }
        }
        StateDistributionVector *isdv=new StateDistributionVector(isd);
        this->SetISD(isdv);

    }
    else
    {
        cout << "Not including positions" << endl;
        _m_includePositions = false;
        //the s_vec has the form <fl...fl_h>
        _m_nrStateFeatures = nrHouses;        
        _m_nrPerStateFeatureVec = _m_nrFLs_vec;

        if(DEBUG_PFF)
            cout << "_m_nrPerStateFeatureVec=" <<
                SoftPrintVector(_m_nrPerStateFeatureVec) << endl;

        size_t nrS = _m_nrJointFirelevels;
        if(DEBUG_PFF)
            cout << "nrStates="<<nrS<<endl;
        for(Index sI = 0; sI < nrS; sI++)
        {
            vector< Index> s_vec = GetStateVector(sI);
            stringstream ss;
            ss << "S_" << SoftPrintVector(s_vec);
            this->AddState(ss.str());
            if(DEBUG_PFF)
            {
                cout << "added " << this->GetState(sI)->SoftPrintBrief()<<endl;
            }
        }
        SetUniformISD();
    }

    SetStatesInitialized(true);
    SetDiscount(1);
    
    // add actions:
    ConstructActions();
    if(DEBUG_CJA) cout << ">>>Creating joint actions and set..."<<endl;
    // add joint actions
    size_t testNRJA = ConstructJointActions();
    if(DEBUG_CA) cout << "testNRJA="<<testNRJA<<endl;    

    SetActionsInitialized(true);

    // add observations:
    ConstructObservations();
    size_t testNRJO = ConstructJointObservations();
    if(DEBUG_CO) cout << "testNRJO="<<testNRJO<<endl;

    SetObservationsInitialized(true);

    // add the transition model
    if(DEBUG_PFF) cout << ">>>Adding Transition model..."<<endl;
    CreateNewTransitionModel();
    FillTransitionModel();    

    // add observation model
    if(DEBUG_PFF) cout << ">>>Adding Observation model..."<<endl;
    CreateNewObservationModel();
    FillObservationModel();
    MultiAgentDecisionProcessDiscrete::SetInitialized(true);

    // add rewards
    CreateNewRewardModel();
    FillRewardModel();
    if(DEBUG_PFF)     cout << "Model created..."<<endl; 
    DecPOMDPDiscrete::SetInitialized(true);
}